

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O0

void mdct_init(mdct_lookup *lookup,int n)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  float *pfVar4;
  byte bVar5;
  double dVar6;
  double dVar7;
  uint local_48;
  int acc;
  int msb;
  int j;
  int i_1;
  int mask;
  int log2n;
  int n2;
  int i;
  float *T;
  int *bitrev;
  int n_local;
  mdct_lookup *lookup_local;
  
  piVar3 = (int *)malloc((long)(n / 4) << 2);
  pfVar4 = (float *)malloc((long)(n + n / 4) << 2);
  dVar6 = log((double)n);
  dVar7 = log(2.0);
  dVar6 = rint(dVar6 / dVar7);
  lookup->log2n = (int)dVar6;
  lookup->n = n;
  lookup->trig = pfVar4;
  lookup->bitrev = piVar3;
  for (log2n = 0; log2n < n / 4; log2n = log2n + 1) {
    dVar7 = cos((3.141592653589793 / (double)n) * (double)(log2n << 2));
    pfVar4[log2n << 1] = (float)dVar7;
    dVar7 = sin((3.141592653589793 / (double)n) * (double)(log2n << 2));
    pfVar4[log2n * 2 + 1] = (float)-dVar7;
    dVar7 = cos((3.141592653589793 / (double)(n << 1)) * (double)(log2n * 2 + 1));
    pfVar4[(n >> 1) + log2n * 2] = (float)dVar7;
    dVar7 = sin((3.141592653589793 / (double)(n << 1)) * (double)(log2n * 2 + 1));
    pfVar4[(n >> 1) + log2n * 2 + 1] = (float)dVar7;
  }
  for (log2n = 0; log2n < n / 8; log2n = log2n + 1) {
    dVar7 = cos((3.141592653589793 / (double)n) * (double)(log2n * 4 + 2));
    pfVar4[n + log2n * 2] = (float)(dVar7 * 0.5);
    dVar7 = sin((3.141592653589793 / (double)n) * (double)(log2n * 4 + 2));
    pfVar4[n + log2n * 2 + 1] = (float)(-dVar7 * 0.5);
  }
  cVar1 = (char)(int)dVar6;
  iVar2 = 1 << (cVar1 - 2U & 0x1f);
  for (msb = 0; msb < n / 8; msb = msb + 1) {
    local_48 = 0;
    for (acc = 0; bVar5 = (byte)acc, iVar2 >> (bVar5 & 0x1f) != 0; acc = acc + 1) {
      if ((iVar2 >> (bVar5 & 0x1f) & msb) != 0) {
        local_48 = 1 << (bVar5 & 0x1f) | local_48;
      }
    }
    piVar3[msb << 1] = ((local_48 ^ 0xffffffff) & (1 << (cVar1 - 1U & 0x1f)) - 1U) - 1;
    piVar3[msb * 2 + 1] = local_48;
  }
  lookup->scale = 4.0 / (float)n;
  return;
}

Assistant:

void mdct_init(mdct_lookup *lookup,int n){
  int   *bitrev=_ogg_malloc(sizeof(*bitrev)*(n/4));
  DATA_TYPE *T=_ogg_malloc(sizeof(*T)*(n+n/4));

  int i;
  int n2=n>>1;
  int log2n=lookup->log2n=rint(log((float)n)/log(2.f));
  lookup->n=n;
  lookup->trig=T;
  lookup->bitrev=bitrev;

/* trig lookups... */

  for(i=0;i<n/4;i++){
    T[i*2]=FLOAT_CONV(cos((M_PI/n)*(4*i)));
    T[i*2+1]=FLOAT_CONV(-sin((M_PI/n)*(4*i)));
    T[n2+i*2]=FLOAT_CONV(cos((M_PI/(2*n))*(2*i+1)));
    T[n2+i*2+1]=FLOAT_CONV(sin((M_PI/(2*n))*(2*i+1)));
  }
  for(i=0;i<n/8;i++){
    T[n+i*2]=FLOAT_CONV(cos((M_PI/n)*(4*i+2))*.5);
    T[n+i*2+1]=FLOAT_CONV(-sin((M_PI/n)*(4*i+2))*.5);
  }

  /* bitreverse lookup... */

  {
    int mask=(1<<(log2n-1))-1,i,j;
    int msb=1<<(log2n-2);
    for(i=0;i<n/8;i++){
      int acc=0;
      for(j=0;msb>>j;j++)
        if((msb>>j)&i)acc|=1<<j;
      bitrev[i*2]=((~acc)&mask)-1;
      bitrev[i*2+1]=acc;

    }
  }
  lookup->scale=FLOAT_CONV(4.f/n);
}